

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::ipc::HostImpl::HostImpl(HostImpl *this,char *socket_name,TaskRunner *task_runner)

{
  _Rb_tree_header *p_Var1;
  uint __errnum;
  _Head_base<0UL,_perfetto::base::UnixSocket_*,_false> __p;
  char *fname;
  uint *puVar2;
  char *pcVar3;
  allocator<char> local_59;
  _Head_base<0UL,_perfetto::base::UnixSocket_*,_false> local_58;
  string local_50;
  
  (this->super_Host)._vptr_Host = (_func_int **)&PTR__HostImpl_00409b80;
  (this->super_EventListener)._vptr_EventListener = (_func_int **)&PTR__HostImpl_00409bc8;
  this->task_runner_ = task_runner;
  p_Var1 = &(this->services_)._M_t._M_impl.super__Rb_tree_header;
  (this->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->clients_)._M_t._M_impl.super__Rb_tree_header;
  (this->services_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sock_)._M_t.
  super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
  .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl = (UnixSocket *)0x0;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->clients_by_socket_)._M_t._M_impl.super__Rb_tree_header;
  (this->clients_by_socket_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->clients_by_socket_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->clients_by_socket_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->clients_by_socket_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->clients_by_socket_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->last_service_id_ = 0;
  this->last_client_id_ = 0;
  base::WeakPtrFactory<perfetto::ipc::HostImpl>::WeakPtrFactory(&this->weak_ptr_factory_,this);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,socket_name,&local_59);
  base::UnixSocket::Listen
            ((UnixSocket *)&local_58,&local_50,&this->super_EventListener,this->task_runner_,kUnix,
             kStream);
  __p._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (UnixSocket *)0x0;
  std::__uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
  ::reset((__uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
           *)&this->sock_,__p._M_head_impl);
  std::unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
  ~unique_ptr((unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
               *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_50);
  if ((this->sock_)._M_t.
      super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
      ._M_t.
      super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
      .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl == (UnixSocket *)0x0)
  {
    fname = base::Basename(
                          "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                          );
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    base::LogMessage(kLogError,fname,0x1120b,"Failed to create %s (errno: %d, %s)",socket_name,
                     (ulong)__errnum,pcVar3);
  }
  return;
}

Assistant:

HostImpl::HostImpl(const char* socket_name, base::TaskRunner* task_runner)
    : task_runner_(task_runner), weak_ptr_factory_(this) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  sock_ = base::UnixSocket::Listen(socket_name, this, task_runner_,
                                   kHostSockFamily, base::SockType::kStream);
  if (!sock_) {
    PERFETTO_PLOG("Failed to create %s", socket_name);
  }
}